

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# cmQtAutoGenInitializer.cxx
# Opt level: O3

bool __thiscall cmQtAutoGenInitializer::InitScanFiles(cmQtAutoGenInitializer *this)

{
  _Prime_rehash_policy *filename;
  cmQtAutoGenGlobalInitializer *pcVar1;
  cmSourceFile *this_00;
  size_t sVar2;
  _Base_ptr p_Var3;
  pointer pbVar4;
  pointer ppcVar5;
  pointer ppMVar6;
  MUFile *text;
  pointer pQVar7;
  pointer pcVar8;
  anon_struct_456_13_9a36c67e_for_AutogenTarget *paVar9;
  anon_struct_456_13_9a36c67e_for_AutogenTarget *paVar10;
  cmQtAutoGenInitializer *pcVar11;
  undefined8 uVar12;
  size_type sVar13;
  bool bVar14;
  bool bVar15;
  byte bVar16;
  FileFormat FVar17;
  int iVar18;
  string *psVar19;
  string *psVar20;
  char *pcVar21;
  iterator iVar22;
  mapped_type *this_01;
  string *in_RCX;
  ulong uVar23;
  Keywords *pKVar24;
  byte bVar25;
  cmMakefile *extraout_RDX;
  cmMakefile *extraout_RDX_00;
  cmMakefile *extraout_RDX_01;
  cmMakefile *pcVar26;
  cmMakefile *extraout_RDX_02;
  cmMakefile *extraout_RDX_03;
  cmMakefile *extraout_RDX_04;
  cmMakefile *extraout_RDX_05;
  cmMakefile *extraout_RDX_06;
  cmMakefile *extraout_RDX_07;
  cmMakefile *extraout_RDX_08;
  cmMakefile *extraout_RDX_09;
  pointer pbVar27;
  unique_ptr<cmQtAutoGenInitializer::MUFile,_std::default_delete<cmQtAutoGenInitializer::MUFile>_>
  *eMuf;
  undefined8 uVar28;
  long lVar29;
  pointer pQVar30;
  pointer ppMVar31;
  long lVar32;
  pointer pQVar33;
  undefined1 rcc;
  undefined8 in_R8;
  _Alloc_hider _Var34;
  anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
  *paVar35;
  Qrc *qrc_1;
  pointer pQVar36;
  iterator __begin3;
  pointer ppcVar37;
  vector<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
  *files;
  _Hashtable<cmSourceFile_*,_std::pair<cmSourceFile_*const,_std::unique_ptr<cmQtAutoGenInitializer::MUFile,_std::default_delete<cmQtAutoGenInitializer::MUFile>_>_>,_std::allocator<std::pair<cmSourceFile_*const,_std::unique_ptr<cmQtAutoGenInitializer::MUFile,_std::default_delete<cmQtAutoGenInitializer::MUFile>_>_>_>,_std::__detail::_Select1st,_std::equal_to<cmSourceFile_*>,_std::hash<cmSourceFile_*>,_std::__detail::_Mod_range_hashing,_std::__detail::_Default_ranged_hash,_std::__detail::_Prime_rehash_policy,_std::__detail::_Hashtable_traits<false,_false,_true>_>
  *p_Var38;
  pair<std::__detail::_Node_iterator<std::pair<cmSourceFile_*const,_std::unique_ptr<cmQtAutoGenInitializer::MUFile,_std::default_delete<cmQtAutoGenInitializer::MUFile>_>_>,_false,_false>,_bool>
  pVar39;
  pair<std::_Rb_tree_iterator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_bool>
  pVar40;
  string pathError;
  string opts;
  vector<std::unique_ptr<cmQtAutoGenInitializer::MUFile,_std::default_delete<cmQtAutoGenInitializer::MUFile>_>,_std::allocator<std::unique_ptr<cmQtAutoGenInitializer::MUFile,_std::default_delete<cmQtAutoGenInitializer::MUFile>_>_>_>
  extraHeaders;
  vector<cmSourceFile_*,_std::allocator<cmSourceFile_*>_> srcFiles;
  cmSourceFile *sf;
  anon_class_16_2_e88080e7 makeMUFile;
  Qrc qrc;
  undefined1 local_2b8 [40];
  cmQtAutoGenInitializer *local_290;
  undefined1 local_288 [40];
  _Hashtable<cmSourceFile_*,_std::pair<cmSourceFile_*const,_std::unique_ptr<cmQtAutoGenInitializer::MUFile,_std::default_delete<cmQtAutoGenInitializer::MUFile>_>_>,_std::allocator<std::pair<cmSourceFile_*const,_std::unique_ptr<cmQtAutoGenInitializer::MUFile,_std::default_delete<cmQtAutoGenInitializer::MUFile>_>_>_>,_std::__detail::_Select1st,_std::equal_to<cmSourceFile_*>,_std::hash<cmSourceFile_*>,_std::__detail::_Mod_range_hashing,_std::__detail::_Default_ranged_hash,_std::__detail::_Prime_rehash_policy,_std::__detail::_Hashtable_traits<false,_false,_true>_>
  *local_260;
  cmMakefile *local_258;
  cmMakefile *local_250;
  anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
  local_248;
  undefined8 local_238;
  anon_class_16_2_e88080e7 local_228;
  string local_218;
  cmQtAutoGenGlobalInitializer *local_1f8;
  cmake *local_1f0;
  cmake *local_1e8;
  vector<std::__cxx11::string,std::allocator<std::__cxx11::string>> *local_1e0;
  string *local_1d8;
  string *local_1d0;
  anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
  local_1c8;
  undefined1 local_1b8 [16];
  undefined1 local_1a8 [16];
  string local_198;
  anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
  local_178;
  anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
  local_168;
  _Alloc_hider local_158;
  size_type local_150;
  anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
  local_148;
  _Alloc_hider local_138;
  size_type local_130;
  anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
  local_128;
  _Alloc_hider local_118;
  size_type local_110;
  anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
  local_108;
  undefined1 local_f0 [24];
  _Alloc_hider local_d8;
  size_t local_d0;
  anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
  local_c8;
  anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
  local_b8;
  undefined2 local_a8;
  vector<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
  local_a0;
  pointer pbStack_88;
  pointer local_80;
  pointer pbStack_78;
  string local_70;
  vector<std::vector<std::__cxx11::string,std::allocator<std::__cxx11::string>>,std::allocator<std::vector<std::__cxx11::string,std::allocator<std::__cxx11::string>>>>
  *local_50;
  vector<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
  local_48;
  
  local_258 = cmTarget::GetMakefile(this->Target->Target);
  pcVar1 = this->GlobalInitializer;
  local_1c8._8_8_ = &pcVar1->Keywords_;
  local_218._M_dataplus._M_p = (pointer)0x0;
  local_218._M_string_length = 0;
  local_218.field_2._0_8_ = 0;
  local_290 = this;
  local_1c8._M_allocated_capacity = (size_type)this;
  cmGeneratorTarget::GetConfigCommonSourceFiles
            (this->Target,(vector<cmSourceFile_*,_std::allocator<cmSourceFile_*>_> *)&local_218);
  sVar13 = local_218._M_string_length;
  if (local_218._M_dataplus._M_p != (pointer)local_218._M_string_length) {
    local_228.kw = (Keywords *)&(local_290->AutogenTarget).FilesGenerated;
    local_260 = &(local_290->AutogenTarget).Sources._M_h;
    local_250 = (cmMakefile *)&(local_290->AutogenTarget).Headers;
    local_1f0 = (cmake *)&(pcVar1->Keywords_).SKIP_AUTOGEN;
    local_1d0 = &(pcVar1->Keywords_).SKIP_AUTORCC;
    in_RCX = &(pcVar1->Keywords_).AUTORCC_OPTIONS;
    local_1e0 = (vector<std::__cxx11::string,std::allocator<std::__cxx11::string>> *)
                &(local_290->Rcc).Qrcs;
    _Var34._M_p = local_218._M_dataplus._M_p;
    local_1d8 = in_RCX;
    do {
      this_00 = *(cmSourceFile **)_Var34._M_p;
      local_2b8._0_8_ = local_2b8 + 0x10;
      local_2b8._8_8_ = (Keywords *)0x0;
      local_2b8._16_8_ = local_2b8._16_8_ & 0xffffffffffffff00;
      psVar19 = cmSourceFile::GetFullPath(this_00,(string *)local_2b8);
      if (((Keywords *)local_2b8._8_8_ == (Keywords *)0x0) && (psVar19->_M_string_length != 0)) {
        psVar20 = cmSourceFile::GetExtension_abi_cxx11_(this_00);
        if (((local_290->Moc).super_GenVarsT.Enabled != false) ||
           (((local_290->Uic).super_GenVarsT.Enabled & 1U) != 0)) {
          FVar17 = cmSystemTools::GetFileFormat(psVar20);
          if (FVar17 == CXX_FILE_FORMAT) {
            in_R8 = 1;
            in_RCX = psVar19;
            InitScanFiles::anon_class_16_2_e88080e7::operator()
                      ((anon_class_16_2_e88080e7 *)local_288,(cmSourceFile *)&local_1c8,
                       (string *)this_00,SUB81(psVar19,0));
            if (((*(bool *)(local_288._0_8_ + 0x2b) != false) ||
                (*(bool *)(local_288._0_8_ + 0x2c) == true)) &&
               (*(bool *)(local_288._0_8_ + 0x28) == true)) {
              local_1b8._0_8_ = local_288._0_8_;
              std::
              vector<cmQtAutoGenInitializer::MUFile*,std::allocator<cmQtAutoGenInitializer::MUFile*>>
              ::emplace_back<cmQtAutoGenInitializer::MUFile*>
                        ((vector<cmQtAutoGenInitializer::MUFile*,std::allocator<cmQtAutoGenInitializer::MUFile*>>
                          *)local_228.kw,(MUFile **)local_1b8);
            }
            std::
            _Hashtable<cmSourceFile*,std::pair<cmSourceFile*const,std::unique_ptr<cmQtAutoGenInitializer::MUFile,std::default_delete<cmQtAutoGenInitializer::MUFile>>>,std::allocator<std::pair<cmSourceFile*const,std::unique_ptr<cmQtAutoGenInitializer::MUFile,std::default_delete<cmQtAutoGenInitializer::MUFile>>>>,std::__detail::_Select1st,std::equal_to<cmSourceFile*>,std::hash<cmSourceFile*>,std::__detail::_Mod_range_hashing,std::__detail::_Default_ranged_hash,std::__detail::_Prime_rehash_policy,std::__detail::_Hashtable_traits<false,false,true>>
            ::
            _M_emplace<cmSourceFile*&,std::unique_ptr<cmQtAutoGenInitializer::MUFile,std::default_delete<cmQtAutoGenInitializer::MUFile>>>
                      ((_Hashtable<cmSourceFile*,std::pair<cmSourceFile*const,std::unique_ptr<cmQtAutoGenInitializer::MUFile,std::default_delete<cmQtAutoGenInitializer::MUFile>>>,std::allocator<std::pair<cmSourceFile*const,std::unique_ptr<cmQtAutoGenInitializer::MUFile,std::default_delete<cmQtAutoGenInitializer::MUFile>>>>,std::__detail::_Select1st,std::equal_to<cmSourceFile*>,std::hash<cmSourceFile*>,std::__detail::_Mod_range_hashing,std::__detail::_Default_ranged_hash,std::__detail::_Prime_rehash_policy,std::__detail::_Hashtable_traits<false,false,true>>
                        *)local_260,(pointer)(local_288._0_8_ + 0x20),local_288);
          }
          else {
            if (FVar17 != HEADER_FILE_FORMAT) goto LAB_003765d7;
            in_R8 = 1;
            in_RCX = psVar19;
            InitScanFiles::anon_class_16_2_e88080e7::operator()
                      ((anon_class_16_2_e88080e7 *)local_288,(cmSourceFile *)&local_1c8,
                       (string *)this_00,SUB81(psVar19,0));
            if (((*(bool *)(local_288._0_8_ + 0x2b) != false) ||
                (*(bool *)(local_288._0_8_ + 0x2c) == true)) &&
               (*(bool *)(local_288._0_8_ + 0x28) == true)) {
              local_1b8._0_8_ = local_288._0_8_;
              std::
              vector<cmQtAutoGenInitializer::MUFile*,std::allocator<cmQtAutoGenInitializer::MUFile*>>
              ::emplace_back<cmQtAutoGenInitializer::MUFile*>
                        ((vector<cmQtAutoGenInitializer::MUFile*,std::allocator<cmQtAutoGenInitializer::MUFile*>>
                          *)local_228.kw,(MUFile **)local_1b8);
            }
            std::
            _Hashtable<cmSourceFile*,std::pair<cmSourceFile*const,std::unique_ptr<cmQtAutoGenInitializer::MUFile,std::default_delete<cmQtAutoGenInitializer::MUFile>>>,std::allocator<std::pair<cmSourceFile*const,std::unique_ptr<cmQtAutoGenInitializer::MUFile,std::default_delete<cmQtAutoGenInitializer::MUFile>>>>,std::__detail::_Select1st,std::equal_to<cmSourceFile*>,std::hash<cmSourceFile*>,std::__detail::_Mod_range_hashing,std::__detail::_Default_ranged_hash,std::__detail::_Prime_rehash_policy,std::__detail::_Hashtable_traits<false,false,true>>
            ::
            _M_emplace<cmSourceFile*&,std::unique_ptr<cmQtAutoGenInitializer::MUFile,std::default_delete<cmQtAutoGenInitializer::MUFile>>>
                      ((_Hashtable<cmSourceFile*,std::pair<cmSourceFile*const,std::unique_ptr<cmQtAutoGenInitializer::MUFile,std::default_delete<cmQtAutoGenInitializer::MUFile>>>,std::allocator<std::pair<cmSourceFile*const,std::unique_ptr<cmQtAutoGenInitializer::MUFile,std::default_delete<cmQtAutoGenInitializer::MUFile>>>>,std::__detail::_Select1st,std::equal_to<cmSourceFile*>,std::hash<cmSourceFile*>,std::__detail::_Mod_range_hashing,std::__detail::_Default_ranged_hash,std::__detail::_Prime_rehash_policy,std::__detail::_Hashtable_traits<false,false,true>>
                        *)local_250,(pointer)(local_288._0_8_ + 0x20),local_288);
          }
          if ((cmQtAutoGenInitializer *)local_288._0_8_ != (cmQtAutoGenInitializer *)0x0) {
            std::default_delete<cmQtAutoGenInitializer::MUFile>::operator()
                      ((default_delete<cmQtAutoGenInitializer::MUFile> *)local_288,
                       (MUFile *)local_288._0_8_);
          }
        }
LAB_003765d7:
        if ((((local_290->Rcc).super_GenVarsT.Enabled == true) &&
            (sVar2 = psVar20->_M_string_length, sVar2 == (pcVar1->Keywords_).qrc._M_string_length))
           && (((sVar2 == 0 ||
                (iVar18 = bcmp((psVar20->_M_dataplus)._M_p,(pcVar1->Keywords_).qrc._M_dataplus._M_p,
                               sVar2), iVar18 == 0)) &&
               ((bVar14 = cmSourceFile::GetPropertyAsBool(this_00,(string *)local_1f0), !bVar14 &&
                (bVar14 = cmSourceFile::GetPropertyAsBool(this_00,local_1d0), !bVar14)))))) {
          local_1b8._0_8_ = local_1b8 + 0x10;
          in_RCX = (string *)0x0;
          local_1b8._8_8_ = (pointer)0x0;
          local_1a8._0_8_ = local_1a8._0_8_ & 0xffffffffffffff00;
          local_198._M_dataplus._M_p = (pointer)&local_198.field_2;
          local_198._M_string_length = 0;
          local_198.field_2._M_local_buf[0] = '\0';
          local_178._M_allocated_capacity = (size_type)&local_168;
          local_178._8_8_ = 0;
          local_168._M_local_buf[0] = '\0';
          local_158._M_p = (pointer)&local_148;
          local_150 = 0;
          local_148._M_local_buf[0] = '\0';
          local_138._M_p = (pointer)&local_128;
          local_130 = 0;
          local_128._M_local_buf[0] = '\0';
          local_118._M_p = (pointer)&local_108;
          local_110 = 0;
          local_108._M_local_buf[0] = '\0';
          local_f0._0_4_ = _S_red;
          local_f0._8_8_ = (_Base_ptr)0x0;
          local_f0._16_8_ = local_f0;
          local_d0 = 0;
          local_c8._M_allocated_capacity = (size_type)&local_b8;
          local_c8._8_8_ = 0;
          local_b8._M_local_buf[0] = '\0';
          local_a8._0_1_ = false;
          local_a8._1_1_ = false;
          local_80 = (pointer)0x0;
          pbStack_78 = (pointer)0x0;
          local_a0.
          super__Vector_base<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
          ._M_impl.super__Vector_impl_data._M_end_of_storage = (pointer)0x0;
          pbStack_88 = (pointer)0x0;
          local_a0.
          super__Vector_base<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
          ._M_impl.super__Vector_impl_data._M_start = (pointer)0x0;
          local_a0.
          super__Vector_base<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
          ._M_impl.super__Vector_impl_data._M_finish = (pointer)0x0;
          local_d8._M_p = (pointer)local_f0._16_8_;
          cmsys::SystemTools::GetRealPath((string *)local_288,psVar19,(string *)0x0);
          std::__cxx11::string::operator=((string *)(local_1a8 + 0x10),(string *)local_288);
          if ((cmQtAutoGenInitializer *)local_288._0_8_ !=
              (cmQtAutoGenInitializer *)(local_288 + 0x10)) {
            operator_delete((void *)local_288._0_8_,local_288._16_8_ + 1);
          }
          cmsys::SystemTools::GetFilenameWithoutLastExtension
                    ((string *)local_288,(string *)(local_1a8 + 0x10));
          std::__cxx11::string::operator=((string *)local_178._M_local_buf,(string *)local_288);
          if ((cmQtAutoGenInitializer *)local_288._0_8_ !=
              (cmQtAutoGenInitializer *)(local_288 + 0x10)) {
            operator_delete((void *)local_288._0_8_,local_288._16_8_ + 1);
          }
          local_a8._0_1_ = this_00->IsGenerated;
          pcVar21 = cmSourceFile::GetSafeProperty(this_00,local_1d8);
          std::__cxx11::string::string<std::allocator<char>>
                    ((string *)local_288,pcVar21,(allocator<char> *)local_248._M_local_buf);
          if ((Keywords *)local_288._8_8_ != (Keywords *)0x0) {
            cmSystemTools::ExpandListArgument((string *)local_288,&local_a0,false);
          }
          if ((cmQtAutoGenInitializer *)local_288._0_8_ !=
              (cmQtAutoGenInitializer *)(local_288 + 0x10)) {
            operator_delete((void *)local_288._0_8_,local_288._16_8_ + 1);
          }
          std::vector<cmQtAutoGenInitializer::Qrc,_std::allocator<cmQtAutoGenInitializer::Qrc>_>::
          emplace_back<cmQtAutoGenInitializer::Qrc>
                    ((vector<cmQtAutoGenInitializer::Qrc,_std::allocator<cmQtAutoGenInitializer::Qrc>_>
                      *)local_1e0,(Qrc *)local_1b8);
          Qrc::~Qrc((Qrc *)local_1b8);
        }
      }
      if ((cmMakefile *)local_2b8._0_8_ != (cmMakefile *)(local_2b8 + 0x10)) {
        operator_delete((void *)local_2b8._0_8_,(ulong)(local_2b8._16_8_ + 1));
      }
      _Var34._M_p = _Var34._M_p + 8;
    } while (_Var34._M_p != (pointer)sVar13);
  }
  if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
       *)local_218._M_dataplus._M_p !=
      (anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
       *)0x0) {
    operator_delete(local_218._M_dataplus._M_p,
                    local_218.field_2._0_8_ - (long)local_218._M_dataplus._M_p);
  }
  pcVar11 = local_290;
  cmGeneratorTarget::ClearSourcesCache(local_290->Target);
  bVar14 = (pcVar11->Moc).super_GenVarsT.Enabled;
  uVar23 = CONCAT71((int7)((ulong)in_RCX >> 8),bVar14);
  bVar16 = (pcVar11->Uic).super_GenVarsT.Enabled;
  local_1f8 = pcVar1;
  if (((bVar16 | bVar14) & 1) != 0) {
    local_248._M_allocated_capacity = 0;
    local_248._8_8_ = (cmSourceFile *)0x0;
    local_238 = 0;
    std::
    vector<std::unique_ptr<cmQtAutoGenInitializer::MUFile,_std::default_delete<cmQtAutoGenInitializer::MUFile>_>,_std::allocator<std::unique_ptr<cmQtAutoGenInitializer::MUFile,_std::default_delete<cmQtAutoGenInitializer::MUFile>_>_>_>
    ::reserve((vector<std::unique_ptr<cmQtAutoGenInitializer::MUFile,_std::default_delete<cmQtAutoGenInitializer::MUFile>_>,_std::allocator<std::unique_ptr<cmQtAutoGenInitializer::MUFile,_std::default_delete<cmQtAutoGenInitializer::MUFile>_>_>_>
               *)&local_248,(pcVar11->AutogenTarget).Sources._M_h._M_element_count * 2);
    local_1b8._0_8_ = local_1b8 + 0x10;
    std::__cxx11::string::_M_construct<char_const*>((string *)local_1b8,"");
    paVar35 = &local_198.field_2;
    local_198._M_dataplus._M_p = (pointer)paVar35;
    std::__cxx11::string::_M_construct<char_const*>((string *)(local_1a8 + 0x10),"_p","");
    local_1f0 = cmMakefile::GetCMakeInstance(local_258);
    pKVar24 = (Keywords *)(local_290->AutogenTarget).Sources._M_h._M_before_begin._M_nxt;
    if (pKVar24 != (Keywords *)0x0) {
      local_260 = &(local_290->AutogenTarget).Headers._M_h;
      do {
        p_Var3 = (((_Rep_type *)&pKVar24->AUTOMOC)->_M_impl).super__Rb_tree_header._M_header.
                 _M_parent;
        if ((*(char *)((long)&p_Var3[1]._M_parent + 3) != '\0') ||
           (*(char *)((long)&p_Var3[1]._M_parent + 4) == '\x01')) {
          local_228.kw = pKVar24;
          psVar19 = cmSourceFile::GetFullPath(*(cmSourceFile **)(p_Var3 + 1),(string *)0x0);
          cmQtAutoGen::SubDirPrefix((string *)local_2b8,psVar19);
          cmsys::SystemTools::GetFilenameWithoutLastExtension((string *)local_288,psVar19);
          std::__cxx11::string::_M_append(local_2b8,local_288._0_8_);
          if ((cmQtAutoGenInitializer *)local_288._0_8_ !=
              (cmQtAutoGenInitializer *)(local_288 + 0x10)) {
            operator_delete((void *)local_288._0_8_,local_288._16_8_ + 1);
          }
          p_Var38 = (_Hashtable<cmSourceFile_*,_std::pair<cmSourceFile_*const,_std::unique_ptr<cmQtAutoGenInitializer::MUFile,_std::default_delete<cmQtAutoGenInitializer::MUFile>_>_>,_std::allocator<std::pair<cmSourceFile_*const,_std::unique_ptr<cmQtAutoGenInitializer::MUFile,_std::default_delete<cmQtAutoGenInitializer::MUFile>_>_>_>,_std::__detail::_Select1st,_std::equal_to<cmSourceFile_*>,_std::hash<cmSourceFile_*>,_std::__detail::_Mod_range_hashing,_std::__detail::_Default_ranged_hash,_std::__detail::_Prime_rehash_policy,_std::__detail::_Hashtable_traits<false,_false,_true>_>
                     *)0x0;
          do {
            std::operator+((basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *)
                           local_288,
                           (basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *)
                           local_2b8,
                           (basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *)
                           (local_1b8 + (long)p_Var38));
            local_250 = (cmMakefile *)p_Var38;
            pbVar4 = (local_1f0->HeaderFileExtensions).
                     super__Vector_base<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
                     ._M_impl.super__Vector_impl_data._M_finish;
            for (pbVar27 = (local_1f0->HeaderFileExtensions).
                           super__Vector_base<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
                           ._M_impl.super__Vector_impl_data._M_start; pbVar27 != pbVar4;
                pbVar27 = pbVar27 + 1) {
              local_218._M_dataplus._M_p = (pointer)&local_218.field_2;
              std::__cxx11::string::_M_construct<char*>
                        ((string *)&local_218,local_288._0_8_,
                         (pointer)(local_288._0_8_ + (long)(string *)local_288._8_8_));
              bVar14 = SUB81(&local_218,0);
              std::__cxx11::string::push_back(bVar14);
              std::__cxx11::string::_M_append((char *)&local_218,(ulong)(pbVar27->_M_dataplus)._M_p)
              ;
              local_1e8 = (cmake *)cmMakefile::GetSource(local_258,&local_218,Known);
              if (local_1e8 == (cmake *)0x0) {
                bVar15 = cmsys::SystemTools::FileExists(&local_218);
                if (bVar15) {
                  local_1e8 = (cmake *)cmMakefile::CreateSource(local_258,&local_218,false,Known);
                }
                if (local_1e8 != (cmake *)0x0) goto LAB_00376b26;
              }
              else {
                iVar22 = std::
                         _Hashtable<cmSourceFile_*,_std::pair<cmSourceFile_*const,_std::unique_ptr<cmQtAutoGenInitializer::MUFile,_std::default_delete<cmQtAutoGenInitializer::MUFile>_>_>,_std::allocator<std::pair<cmSourceFile_*const,_std::unique_ptr<cmQtAutoGenInitializer::MUFile,_std::default_delete<cmQtAutoGenInitializer::MUFile>_>_>_>,_std::__detail::_Select1st,_std::equal_to<cmSourceFile_*>,_std::hash<cmSourceFile_*>,_std::__detail::_Mod_range_hashing,_std::__detail::_Default_ranged_hash,_std::__detail::_Prime_rehash_policy,_std::__detail::_Hashtable_traits<false,_false,_true>_>
                         ::find(local_260,(key_type *)&local_1e8);
                if ((iVar22.
                     super__Node_iterator_base<std::pair<cmSourceFile_*const,_std::unique_ptr<cmQtAutoGenInitializer::MUFile,_std::default_delete<cmQtAutoGenInitializer::MUFile>_>_>,_false>
                     ._M_cur == (__node_type *)0x0) &&
                   ((*(char *)((long)&local_1e8->UsedCliVariables + 0x29) != '\0' ||
                    (bVar15 = cmsys::SystemTools::FileExists(&local_218),
                    bVar15 && local_1e8 != (cmake *)0x0)))) {
LAB_00376b26:
                  in_R8 = 1;
                  InitScanFiles::anon_class_16_2_e88080e7::operator()
                            (&local_228,(cmSourceFile *)&local_1c8,(string *)local_1e8,bVar14);
                  if (*(char *)((long)&p_Var3[1]._M_parent + 3) == '\0') {
                    *(bool *)((long)&((local_228.this)->ConfigDefault)._M_string_length + 3) = false
                    ;
                  }
                  if (*(char *)((long)&p_Var3[1]._M_parent + 4) == '\0') {
                    *(bool *)((long)&((local_228.this)->ConfigDefault)._M_string_length + 4) = false
                    ;
                  }
                  std::
                  vector<std::unique_ptr<cmQtAutoGenInitializer::MUFile,std::default_delete<cmQtAutoGenInitializer::MUFile>>,std::allocator<std::unique_ptr<cmQtAutoGenInitializer::MUFile,std::default_delete<cmQtAutoGenInitializer::MUFile>>>>
                  ::
                  emplace_back<std::unique_ptr<cmQtAutoGenInitializer::MUFile,std::default_delete<cmQtAutoGenInitializer::MUFile>>>
                            ((vector<std::unique_ptr<cmQtAutoGenInitializer::MUFile,std::default_delete<cmQtAutoGenInitializer::MUFile>>,std::allocator<std::unique_ptr<cmQtAutoGenInitializer::MUFile,std::default_delete<cmQtAutoGenInitializer::MUFile>>>>
                              *)local_248._M_local_buf,
                             (unique_ptr<cmQtAutoGenInitializer::MUFile,_std::default_delete<cmQtAutoGenInitializer::MUFile>_>
                              *)&local_228);
                  if (local_228.this != (cmQtAutoGenInitializer *)0x0) {
                    std::default_delete<cmQtAutoGenInitializer::MUFile>::operator()
                              ((default_delete<cmQtAutoGenInitializer::MUFile> *)&local_228,
                               (MUFile *)local_228.this);
                  }
                }
              }
              if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
                   *)local_218._M_dataplus._M_p != &local_218.field_2) {
                operator_delete(local_218._M_dataplus._M_p,local_218.field_2._0_8_ + 1);
              }
            }
            if ((cmQtAutoGenInitializer *)local_288._0_8_ !=
                (cmQtAutoGenInitializer *)(local_288 + 0x10)) {
              operator_delete((void *)local_288._0_8_,local_288._16_8_ + 1);
            }
            p_Var38 = (_Hashtable<cmSourceFile_*,_std::pair<cmSourceFile_*const,_std::unique_ptr<cmQtAutoGenInitializer::MUFile,_std::default_delete<cmQtAutoGenInitializer::MUFile>_>_>,_std::allocator<std::pair<cmSourceFile_*const,_std::unique_ptr<cmQtAutoGenInitializer::MUFile,_std::default_delete<cmQtAutoGenInitializer::MUFile>_>_>_>,_std::__detail::_Select1st,_std::equal_to<cmSourceFile_*>,_std::hash<cmSourceFile_*>,_std::__detail::_Mod_range_hashing,_std::__detail::_Default_ranged_hash,_std::__detail::_Prime_rehash_policy,_std::__detail::_Hashtable_traits<false,_false,_true>_>
                       *)((long)local_250 + 0x20);
          } while (p_Var38 !=
                   (_Hashtable<cmSourceFile_*,_std::pair<cmSourceFile_*const,_std::unique_ptr<cmQtAutoGenInitializer::MUFile,_std::default_delete<cmQtAutoGenInitializer::MUFile>_>_>,_std::allocator<std::pair<cmSourceFile_*const,_std::unique_ptr<cmQtAutoGenInitializer::MUFile,_std::default_delete<cmQtAutoGenInitializer::MUFile>_>_>_>,_std::__detail::_Select1st,_std::equal_to<cmSourceFile_*>,_std::hash<cmSourceFile_*>,_std::__detail::_Mod_range_hashing,_std::__detail::_Default_ranged_hash,_std::__detail::_Prime_rehash_policy,_std::__detail::_Hashtable_traits<false,_false,_true>_>
                    *)0x40);
          pKVar24 = local_228.kw;
          if ((cmMakefile *)local_2b8._0_8_ != (cmMakefile *)(local_2b8 + 0x10)) {
            operator_delete((void *)local_2b8._0_8_,(ulong)(local_2b8._16_8_ + 1));
            pKVar24 = local_228.kw;
          }
        }
        pKVar24 = *(Keywords **)&((_Rep_type *)&pKVar24->AUTOMOC)->_M_impl;
      } while (pKVar24 != (Keywords *)0x0);
    }
    uVar12 = local_248._8_8_;
    if (local_248._M_allocated_capacity != local_248._8_8_) {
      paVar9 = &local_290->AutogenTarget;
      paVar10 = &local_290->AutogenTarget;
      uVar28 = local_248._M_allocated_capacity;
      do {
        pcVar26 = (((cmSourceFile *)uVar28)->Location).Makefile;
        if (((*(undefined1 *)
               ((long)&(pcVar26->FindPackageRootPathStack).
                       super__Deque_base<std::vector<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>,_std::allocator<std::vector<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>_>_>
                       ._M_impl.super__Deque_impl_data._M_start + 0x1b) != '\0') ||
            (*(undefined1 *)
              ((long)&(pcVar26->FindPackageRootPathStack).
                      super__Deque_base<std::vector<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>,_std::allocator<std::vector<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>_>_>
                      ._M_impl.super__Deque_impl_data._M_start + 0x1c) == '\x01')) &&
           (*(char *)((long)&(pcVar26->FindPackageRootPathStack).
                             super__Deque_base<std::vector<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>,_std::allocator<std::vector<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>_>_>
                             ._M_impl.super__Deque_impl_data._M_start + 0x18) == '\x01')) {
          local_2b8._0_8_ = pcVar26;
          std::
          vector<cmQtAutoGenInitializer::MUFile*,std::allocator<cmQtAutoGenInitializer::MUFile*>>::
          emplace_back<cmQtAutoGenInitializer::MUFile*>
                    ((vector<cmQtAutoGenInitializer::MUFile*,std::allocator<cmQtAutoGenInitializer::MUFile*>>
                      *)&paVar9->FilesGenerated,(MUFile **)local_2b8);
          pcVar26 = (((cmSourceFile *)uVar28)->Location).Makefile;
        }
        std::
        _Hashtable<cmSourceFile*,std::pair<cmSourceFile*const,std::unique_ptr<cmQtAutoGenInitializer::MUFile,std::default_delete<cmQtAutoGenInitializer::MUFile>>>,std::allocator<std::pair<cmSourceFile*const,std::unique_ptr<cmQtAutoGenInitializer::MUFile,std::default_delete<cmQtAutoGenInitializer::MUFile>>>>,std::__detail::_Select1st,std::equal_to<cmSourceFile*>,std::hash<cmSourceFile*>,std::__detail::_Mod_range_hashing,std::__detail::_Default_ranged_hash,std::__detail::_Prime_rehash_policy,std::__detail::_Hashtable_traits<false,false,true>>
        ::
        _M_emplace<cmSourceFile*&,std::unique_ptr<cmQtAutoGenInitializer::MUFile,std::default_delete<cmQtAutoGenInitializer::MUFile>>>
                  ((_Hashtable<cmSourceFile*,std::pair<cmSourceFile*const,std::unique_ptr<cmQtAutoGenInitializer::MUFile,std::default_delete<cmQtAutoGenInitializer::MUFile>>>,std::allocator<std::pair<cmSourceFile*const,std::unique_ptr<cmQtAutoGenInitializer::MUFile,std::default_delete<cmQtAutoGenInitializer::MUFile>>>>,std::__detail::_Select1st,std::equal_to<cmSourceFile*>,std::hash<cmSourceFile*>,std::__detail::_Mod_range_hashing,std::__detail::_Default_ranged_hash,std::__detail::_Prime_rehash_policy,std::__detail::_Hashtable_traits<false,false,true>>
                    *)&paVar10->Headers,
                   (_Elt_pointer *)
                   ((long)&(pcVar26->FindPackageRootPathStack).
                           super__Deque_base<std::vector<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>,_std::allocator<std::vector<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>_>_>
                           ._M_impl.super__Deque_impl_data._M_start + 0x10),uVar28);
        uVar28 = &(((cmSourceFile *)uVar28)->Location).AmbiguousDirectory;
      } while (uVar28 != uVar12);
    }
    lVar29 = -0x40;
    do {
      if (paVar35 !=
          (anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
           *)paVar35[-1]._M_allocated_capacity) {
        operator_delete((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
                         *)paVar35[-1]._M_allocated_capacity,paVar35->_M_allocated_capacity + 1);
      }
      paVar35 = paVar35 + -2;
      lVar29 = lVar29 + 0x20;
    } while (lVar29 != 0);
    std::
    vector<std::unique_ptr<cmQtAutoGenInitializer::MUFile,_std::default_delete<cmQtAutoGenInitializer::MUFile>_>,_std::allocator<std::unique_ptr<cmQtAutoGenInitializer::MUFile,_std::default_delete<cmQtAutoGenInitializer::MUFile>_>_>_>
    ::~vector((vector<std::unique_ptr<cmQtAutoGenInitializer::MUFile,_std::default_delete<cmQtAutoGenInitializer::MUFile>_>,_std::allocator<std::unique_ptr<cmQtAutoGenInitializer::MUFile,_std::default_delete<cmQtAutoGenInitializer::MUFile>_>_>_>
               *)&local_248);
    uVar23 = CONCAT71((int7)((ulong)pKVar24 >> 8),(local_290->Moc).super_GenVarsT.Enabled);
    bVar16 = (local_290->Uic).super_GenVarsT.Enabled;
  }
  bVar25 = (byte)(uVar23 & 0xffffffff) | bVar16;
  pcVar26 = (cmMakefile *)CONCAT71((int7)((uVar23 & 0xffffffff) >> 8),bVar25);
  if ((bVar25 & 1) != 0) {
    ppcVar37 = (local_258->SourceFiles).
               super__Vector_base<cmSourceFile_*,_std::allocator<cmSourceFile_*>_>._M_impl.
               super__Vector_impl_data._M_start;
    ppcVar5 = (local_258->SourceFiles).
              super__Vector_base<cmSourceFile_*,_std::allocator<cmSourceFile_*>_>._M_impl.
              super__Vector_impl_data._M_finish;
    pcVar26 = local_258;
    if (ppcVar37 != ppcVar5) {
      local_260 = &(local_290->AutogenTarget).Sources._M_h;
      local_250 = (cmMakefile *)&(local_290->AutogenTarget).Headers;
      local_1f0 = (cmake *)&(local_1f8->Keywords_).SKIP_AUTOGEN;
      local_1d0 = &(local_1f8->Keywords_).SKIP_AUTOUIC;
      local_1d8 = &(local_1f8->Keywords_).AUTOUIC_OPTIONS;
      local_1e0 = (vector<std::__cxx11::string,std::allocator<std::__cxx11::string>> *)
                  &(local_290->Uic).FileFiles;
      local_50 = (vector<std::vector<std::__cxx11::string,std::allocator<std::__cxx11::string>>,std::allocator<std::vector<std::__cxx11::string,std::allocator<std::__cxx11::string>>>>
                  *)&(local_290->Uic).FileOptions;
      local_228.kw = (Keywords *)&(local_290->Uic).SkipUi;
      do {
        local_248._M_allocated_capacity = (size_type)*ppcVar37;
        local_1b8._8_8_ = (pointer)0x0;
        local_1a8._0_8_ = local_1a8._0_8_ & 0xffffffffffffff00;
        local_1b8._0_8_ = (cmQtAutoGenInitializer *)(local_1b8 + 0x10);
        psVar19 = cmSourceFile::GetFullPath
                            ((cmSourceFile *)local_248._M_allocated_capacity,(string *)local_1b8);
        pcVar26 = extraout_RDX;
        if (((pointer)local_1b8._8_8_ == (pointer)0x0) && (psVar19->_M_string_length != 0)) {
          psVar20 = cmSourceFile::GetExtension_abi_cxx11_
                              ((cmSourceFile *)local_248._M_allocated_capacity);
          FVar17 = cmSystemTools::GetFileFormat(psVar20);
          if (FVar17 == CXX_FILE_FORMAT) {
            iVar22 = std::
                     _Hashtable<cmSourceFile_*,_std::pair<cmSourceFile_*const,_std::unique_ptr<cmQtAutoGenInitializer::MUFile,_std::default_delete<cmQtAutoGenInitializer::MUFile>_>_>,_std::allocator<std::pair<cmSourceFile_*const,_std::unique_ptr<cmQtAutoGenInitializer::MUFile,_std::default_delete<cmQtAutoGenInitializer::MUFile>_>_>_>,_std::__detail::_Select1st,_std::equal_to<cmSourceFile_*>,_std::hash<cmSourceFile_*>,_std::__detail::_Mod_range_hashing,_std::__detail::_Default_ranged_hash,_std::__detail::_Prime_rehash_policy,_std::__detail::_Hashtable_traits<false,_false,_true>_>
                     ::find(local_260,(key_type *)&local_248._M_allocated_capacity);
            pcVar26 = extraout_RDX_02;
            if (iVar22.
                super__Node_iterator_base<std::pair<cmSourceFile_*const,_std::unique_ptr<cmQtAutoGenInitializer::MUFile,_std::default_delete<cmQtAutoGenInitializer::MUFile>_>_>,_false>
                ._M_cur == (__node_type *)0x0) {
              in_R8 = 0;
              InitScanFiles::anon_class_16_2_e88080e7::operator()
                        ((anon_class_16_2_e88080e7 *)local_2b8,(cmSourceFile *)&local_1c8,
                         (string *)local_248._M_allocated_capacity,SUB81(psVar19,0));
              if ((*(bool *)(local_2b8._0_8_ + 0x29) != false) ||
                 (*(bool *)(local_2b8._0_8_ + 0x2a) == true)) {
                pVar39 = std::
                         _Hashtable<cmSourceFile*,std::pair<cmSourceFile*const,std::unique_ptr<cmQtAutoGenInitializer::MUFile,std::default_delete<cmQtAutoGenInitializer::MUFile>>>,std::allocator<std::pair<cmSourceFile*const,std::unique_ptr<cmQtAutoGenInitializer::MUFile,std::default_delete<cmQtAutoGenInitializer::MUFile>>>>,std::__detail::_Select1st,std::equal_to<cmSourceFile*>,std::hash<cmSourceFile*>,std::__detail::_Mod_range_hashing,std::__detail::_Default_ranged_hash,std::__detail::_Prime_rehash_policy,std::__detail::_Hashtable_traits<false,false,true>>
                         ::
                         _M_emplace<cmSourceFile*&,std::unique_ptr<cmQtAutoGenInitializer::MUFile,std::default_delete<cmQtAutoGenInitializer::MUFile>>>
                                   ((_Hashtable<cmSourceFile*,std::pair<cmSourceFile*const,std::unique_ptr<cmQtAutoGenInitializer::MUFile,std::default_delete<cmQtAutoGenInitializer::MUFile>>>,std::allocator<std::pair<cmSourceFile*const,std::unique_ptr<cmQtAutoGenInitializer::MUFile,std::default_delete<cmQtAutoGenInitializer::MUFile>>>>,std::__detail::_Select1st,std::equal_to<cmSourceFile*>,std::hash<cmSourceFile*>,std::__detail::_Mod_range_hashing,std::__detail::_Default_ranged_hash,std::__detail::_Prime_rehash_policy,std::__detail::_Hashtable_traits<false,false,true>>
                                     *)local_260,&local_248,local_2b8);
                pcVar26 = pVar39._8_8_;
LAB_00376e95:
                if ((cmMakefile *)local_2b8._0_8_ == (cmMakefile *)0x0) goto LAB_00376f61;
              }
LAB_00376ea2:
              std::default_delete<cmQtAutoGenInitializer::MUFile>::operator()
                        ((default_delete<cmQtAutoGenInitializer::MUFile> *)local_2b8,
                         (MUFile *)local_2b8._0_8_);
              pcVar26 = extraout_RDX_03;
            }
          }
          else if (FVar17 == HEADER_FILE_FORMAT) {
            iVar22 = std::
                     _Hashtable<cmSourceFile_*,_std::pair<cmSourceFile_*const,_std::unique_ptr<cmQtAutoGenInitializer::MUFile,_std::default_delete<cmQtAutoGenInitializer::MUFile>_>_>,_std::allocator<std::pair<cmSourceFile_*const,_std::unique_ptr<cmQtAutoGenInitializer::MUFile,_std::default_delete<cmQtAutoGenInitializer::MUFile>_>_>_>,_std::__detail::_Select1st,_std::equal_to<cmSourceFile_*>,_std::hash<cmSourceFile_*>,_std::__detail::_Mod_range_hashing,_std::__detail::_Default_ranged_hash,_std::__detail::_Prime_rehash_policy,_std::__detail::_Hashtable_traits<false,_false,_true>_>
                     ::find((_Hashtable<cmSourceFile_*,_std::pair<cmSourceFile_*const,_std::unique_ptr<cmQtAutoGenInitializer::MUFile,_std::default_delete<cmQtAutoGenInitializer::MUFile>_>_>,_std::allocator<std::pair<cmSourceFile_*const,_std::unique_ptr<cmQtAutoGenInitializer::MUFile,_std::default_delete<cmQtAutoGenInitializer::MUFile>_>_>_>,_std::__detail::_Select1st,_std::equal_to<cmSourceFile_*>,_std::hash<cmSourceFile_*>,_std::__detail::_Mod_range_hashing,_std::__detail::_Default_ranged_hash,_std::__detail::_Prime_rehash_policy,_std::__detail::_Hashtable_traits<false,_false,_true>_>
                             *)local_250,(key_type *)&local_248._M_allocated_capacity);
            pcVar26 = extraout_RDX_01;
            if (iVar22.
                super__Node_iterator_base<std::pair<cmSourceFile_*const,_std::unique_ptr<cmQtAutoGenInitializer::MUFile,_std::default_delete<cmQtAutoGenInitializer::MUFile>_>_>,_false>
                ._M_cur == (__node_type *)0x0) {
              in_R8 = 0;
              InitScanFiles::anon_class_16_2_e88080e7::operator()
                        ((anon_class_16_2_e88080e7 *)local_2b8,(cmSourceFile *)&local_1c8,
                         (string *)local_248._M_allocated_capacity,SUB81(psVar19,0));
              if ((*(bool *)(local_2b8._0_8_ + 0x29) != false) ||
                 (*(bool *)(local_2b8._0_8_ + 0x2a) == true)) {
                pVar39 = std::
                         _Hashtable<cmSourceFile*,std::pair<cmSourceFile*const,std::unique_ptr<cmQtAutoGenInitializer::MUFile,std::default_delete<cmQtAutoGenInitializer::MUFile>>>,std::allocator<std::pair<cmSourceFile*const,std::unique_ptr<cmQtAutoGenInitializer::MUFile,std::default_delete<cmQtAutoGenInitializer::MUFile>>>>,std::__detail::_Select1st,std::equal_to<cmSourceFile*>,std::hash<cmSourceFile*>,std::__detail::_Mod_range_hashing,std::__detail::_Default_ranged_hash,std::__detail::_Prime_rehash_policy,std::__detail::_Hashtable_traits<false,false,true>>
                         ::
                         _M_emplace<cmSourceFile*&,std::unique_ptr<cmQtAutoGenInitializer::MUFile,std::default_delete<cmQtAutoGenInitializer::MUFile>>>
                                   ((_Hashtable<cmSourceFile*,std::pair<cmSourceFile*const,std::unique_ptr<cmQtAutoGenInitializer::MUFile,std::default_delete<cmQtAutoGenInitializer::MUFile>>>,std::allocator<std::pair<cmSourceFile*const,std::unique_ptr<cmQtAutoGenInitializer::MUFile,std::default_delete<cmQtAutoGenInitializer::MUFile>>>>,std::__detail::_Select1st,std::equal_to<cmSourceFile*>,std::hash<cmSourceFile*>,std::__detail::_Mod_range_hashing,std::__detail::_Default_ranged_hash,std::__detail::_Prime_rehash_policy,std::__detail::_Hashtable_traits<false,false,true>>
                                     *)local_250,&local_248,local_2b8);
                pcVar26 = pVar39._8_8_;
                goto LAB_00376e95;
              }
              goto LAB_00376ea2;
            }
          }
          else {
            pcVar26 = extraout_RDX_00;
            if ((((local_290->Uic).super_GenVarsT.Enabled == true) &&
                (pcVar26 = (cmMakefile *)psVar20->_M_string_length,
                pcVar26 == (cmMakefile *)(local_1f8->Keywords_).ui._M_string_length)) &&
               ((pcVar26 == (cmMakefile *)0x0 ||
                (iVar18 = bcmp((psVar20->_M_dataplus)._M_p,
                               (local_1f8->Keywords_).ui._M_dataplus._M_p,(size_t)pcVar26),
                pcVar26 = extraout_RDX_04, iVar18 == 0)))) {
              cmsys::SystemTools::GetRealPath((string *)local_2b8,psVar19,(string *)0x0);
              bVar14 = cmSourceFile::GetPropertyAsBool
                                 ((cmSourceFile *)local_248._M_allocated_capacity,
                                  (string *)local_1f0);
              if ((bVar14) ||
                 (bVar14 = cmSourceFile::GetPropertyAsBool
                                     ((cmSourceFile *)local_248._M_allocated_capacity,local_1d0),
                 bVar14)) {
                pVar40 = std::
                         _Rb_tree<std::__cxx11::string,std::__cxx11::string,std::_Identity<std::__cxx11::string>,std::less<std::__cxx11::string>,std::allocator<std::__cxx11::string>>
                         ::_M_insert_unique<std::__cxx11::string>
                                   ((_Rb_tree<std::__cxx11::string,std::__cxx11::string,std::_Identity<std::__cxx11::string>,std::less<std::__cxx11::string>,std::allocator<std::__cxx11::string>>
                                     *)local_228.kw,
                                    (basic_string<char,_std::char_traits<char>,_std::allocator<char>_>
                                     *)local_2b8);
                pcVar26 = pVar40._8_8_;
              }
              else {
                pcVar21 = cmSourceFile::GetSafeProperty
                                    ((cmSourceFile *)local_248._M_allocated_capacity,local_1d8);
                std::__cxx11::string::string<std::allocator<char>>
                          ((string *)local_288,pcVar21,(allocator<char> *)&local_218);
                pcVar26 = extraout_RDX_07;
                if ((Keywords *)local_288._8_8_ != (Keywords *)0x0) {
                  std::vector<std::__cxx11::string,std::allocator<std::__cxx11::string>>::
                  emplace_back<std::__cxx11::string>
                            (local_1e0,
                             (basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *)
                             local_2b8);
                  local_218._M_dataplus._M_p = (pointer)0x0;
                  local_218._M_string_length = 0;
                  local_218.field_2._0_8_ = 0;
                  cmSystemTools::ExpandListArgument
                            ((string *)local_288,
                             (vector<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
                              *)&local_218,false);
                  std::
                  vector<std::vector<std::__cxx11::string,std::allocator<std::__cxx11::string>>,std::allocator<std::vector<std::__cxx11::string,std::allocator<std::__cxx11::string>>>>
                  ::
                  emplace_back<std::vector<std::__cxx11::string,std::allocator<std::__cxx11::string>>>
                            (local_50,(vector<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
                                       *)&local_218);
                  std::
                  vector<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
                  ::~vector((vector<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
                             *)&local_218);
                  pcVar26 = extraout_RDX_08;
                }
                if ((cmQtAutoGenInitializer *)local_288._0_8_ !=
                    (cmQtAutoGenInitializer *)(local_288 + 0x10)) {
                  operator_delete((void *)local_288._0_8_,local_288._16_8_ + 1);
                  pcVar26 = extraout_RDX_09;
                }
              }
              if ((cmMakefile *)local_2b8._0_8_ != (cmMakefile *)(local_2b8 + 0x10)) {
                operator_delete((void *)local_2b8._0_8_,(ulong)(local_2b8._16_8_ + 1));
                pcVar26 = extraout_RDX_05;
              }
            }
          }
        }
LAB_00376f61:
        if ((cmQtAutoGenInitializer *)local_1b8._0_8_ !=
            (cmQtAutoGenInitializer *)(local_1b8 + 0x10)) {
          operator_delete((void *)local_1b8._0_8_,(ulong)(local_1a8._0_8_ + 1));
          pcVar26 = extraout_RDX_06;
        }
        ppcVar37 = ppcVar37 + 1;
      } while (ppcVar37 != ppcVar5);
      uVar23 = (ulong)(local_290->Moc).super_GenVarsT.Enabled;
      bVar16 = (local_290->Uic).super_GenVarsT.Enabled;
    }
  }
  if (((uVar23 & 1) != 0) || ((bVar16 & 1) != 0)) {
    ppMVar31 = (local_290->AutogenTarget).FilesGenerated.
               super__Vector_base<cmQtAutoGenInitializer::MUFile_*,_std::allocator<cmQtAutoGenInitializer::MUFile_*>_>
               ._M_impl.super__Vector_impl_data._M_start;
    ppMVar6 = *(pointer *)
               ((long)&(local_290->AutogenTarget).FilesGenerated.
                       super__Vector_base<cmQtAutoGenInitializer::MUFile_*,_std::allocator<cmQtAutoGenInitializer::MUFile_*>_>
                       ._M_impl.super__Vector_impl_data + 8);
    if (ppMVar31 != ppMVar6) {
      if (local_290->CMP0071Accept == true) {
        paVar9 = &local_290->AutogenTarget;
        do {
          std::
          _Rb_tree<std::__cxx11::string,std::__cxx11::string,std::_Identity<std::__cxx11::string>,std::less<std::__cxx11::string>,std::allocator<std::__cxx11::string>>
          ::_M_insert_unique<std::__cxx11::string_const&>
                    ((_Rb_tree<std::__cxx11::string,std::__cxx11::string,std::_Identity<std::__cxx11::string>,std::less<std::__cxx11::string>,std::allocator<std::__cxx11::string>>
                      *)&paVar9->DependFiles,&(*ppMVar31)->RealPath);
          ppMVar31 = ppMVar31 + 1;
        } while (ppMVar31 != ppMVar6);
      }
      else if (local_290->CMP0071Warn == true) {
        local_1b8._0_8_ = local_1b8 + 0x10;
        local_1b8._8_8_ = (pointer)0x0;
        local_1a8._0_8_ = local_1a8._0_8_ & 0xffffffffffffff00;
        cmPolicies::GetPolicyWarning_abi_cxx11_
                  ((string *)local_2b8,(cmPolicies *)0x47,(PolicyID)pcVar26);
        std::__cxx11::string::_M_append(local_1b8,local_2b8._0_8_);
        pcVar26 = (cmMakefile *)(local_2b8 + 0x10);
        if ((cmMakefile *)local_2b8._0_8_ != pcVar26) {
          operator_delete((void *)local_2b8._0_8_,(ulong)(local_2b8._16_8_ + 1));
        }
        std::__cxx11::string::push_back((char)local_1b8);
        local_2b8._8_8_ = (Keywords *)0x0;
        local_2b8._16_8_ = local_2b8._16_8_ & 0xffffffffffffff00;
        local_2b8._0_8_ = pcVar26;
        if (((local_290->Moc).super_GenVarsT.Enabled == true) ||
           ((local_290->Uic).super_GenVarsT.Enabled != false)) {
          std::__cxx11::string::_M_assign((string *)local_2b8);
        }
        std::__cxx11::string::append(local_1b8);
        rcc = (undefined1)in_R8;
        ppMVar31 = (local_290->AutogenTarget).FilesGenerated.
                   super__Vector_base<cmQtAutoGenInitializer::MUFile_*,_std::allocator<cmQtAutoGenInitializer::MUFile_*>_>
                   ._M_impl.super__Vector_impl_data._M_start;
        ppMVar6 = *(pointer *)
                   ((long)&(local_290->AutogenTarget).FilesGenerated.
                           super__Vector_base<cmQtAutoGenInitializer::MUFile_*,_std::allocator<cmQtAutoGenInitializer::MUFile_*>_>
                           ._M_impl.super__Vector_impl_data + 8);
        if (ppMVar31 != ppMVar6) {
          do {
            text = *ppMVar31;
            std::__cxx11::string::append(local_1b8);
            cmQtAutoGen::Quoted((string *)local_288,&text->RealPath);
            std::__cxx11::string::_M_append(local_1b8,local_288._0_8_);
            if ((cmQtAutoGenInitializer *)local_288._0_8_ !=
                (cmQtAutoGenInitializer *)(local_288 + 0x10)) {
              operator_delete((void *)local_288._0_8_,local_288._16_8_ + 1);
            }
            std::__cxx11::string::push_back((char)local_1b8);
            rcc = (undefined1)in_R8;
            ppMVar31 = ppMVar31 + 1;
          } while (ppMVar31 != ppMVar6);
        }
        std::__cxx11::string::append(local_1b8);
        cmQtAutoGen::Tools_abi_cxx11_
                  ((string *)local_288,(cmQtAutoGen *)(ulong)(local_290->Moc).super_GenVarsT.Enabled
                   ,(local_290->Uic).super_GenVarsT.Enabled,false,(bool)rcc);
        std::__cxx11::string::_M_append(local_1b8,local_288._0_8_);
        if ((cmQtAutoGenInitializer *)local_288._0_8_ !=
            (cmQtAutoGenInitializer *)(local_288 + 0x10)) {
          operator_delete((void *)local_288._0_8_,local_288._16_8_ + 1);
        }
        std::__cxx11::string::append(local_1b8);
        std::__cxx11::string::_M_append(local_1b8,local_2b8._0_8_);
        std::__cxx11::string::append(local_1b8);
        std::__cxx11::string::_M_append(local_1b8,local_2b8._0_8_);
        std::__cxx11::string::append(local_1b8);
        cmMakefile::IssueMessage(local_258,AUTHOR_WARNING,(string *)local_1b8);
        if ((cmMakefile *)local_2b8._0_8_ != (cmMakefile *)(local_2b8 + 0x10)) {
          operator_delete((void *)local_2b8._0_8_,(ulong)(local_2b8._16_8_ + 1));
        }
        if ((cmQtAutoGenInitializer *)local_1b8._0_8_ !=
            (cmQtAutoGenInitializer *)(local_1b8 + 0x10)) {
          operator_delete((void *)local_1b8._0_8_,(ulong)(local_1a8._0_8_ + 1));
        }
      }
    }
  }
  if ((local_290->Rcc).Qrcs.
      super__Vector_base<cmQtAutoGenInitializer::Qrc,_std::allocator<cmQtAutoGenInitializer::Qrc>_>.
      _M_impl.super__Vector_impl_data._M_start !=
      *(pointer *)
       ((long)&(local_290->Rcc).Qrcs.
               super__Vector_base<cmQtAutoGenInitializer::Qrc,_std::allocator<cmQtAutoGenInitializer::Qrc>_>
               ._M_impl.super__Vector_impl_data + 8)) {
    local_260 = (_Hashtable<cmSourceFile_*,_std::pair<cmSourceFile_*const,_std::unique_ptr<cmQtAutoGenInitializer::MUFile,_std::default_delete<cmQtAutoGenInitializer::MUFile>_>_>,_std::allocator<std::pair<cmSourceFile_*const,_std::unique_ptr<cmQtAutoGenInitializer::MUFile,_std::default_delete<cmQtAutoGenInitializer::MUFile>_>_>_>,_std::__detail::_Select1st,_std::equal_to<cmSourceFile_*>,_std::hash<cmSourceFile_*>,_std::__detail::_Mod_range_hashing,_std::__detail::_Default_ranged_hash,_std::__detail::_Prime_rehash_policy,_std::__detail::_Hashtable_traits<false,_false,_true>_>
                 *)CONCAT44(local_260._4_4_,(local_290->QtVersion).Major);
    local_248._M_allocated_capacity = 0;
    local_248._8_8_ = 0;
    local_238 = 0;
    pcVar21 = cmGeneratorTarget::GetSafeProperty
                        (local_290->Target,&(local_1f8->Keywords_).AUTORCC_OPTIONS);
    std::__cxx11::string::string<std::allocator<char>>
              ((string *)local_1b8,pcVar21,(allocator<char> *)local_2b8);
    cmSystemTools::ExpandListArgument
              ((string *)local_1b8,
               (vector<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
                *)&local_248,false);
    if ((cmQtAutoGenInitializer *)local_1b8._0_8_ != (cmQtAutoGenInitializer *)(local_1b8 + 0x10)) {
      operator_delete((void *)local_1b8._0_8_,(ulong)(local_1a8._0_8_ + 1));
    }
    pQVar33 = (local_290->Rcc).Qrcs.
              super__Vector_base<cmQtAutoGenInitializer::Qrc,_std::allocator<cmQtAutoGenInitializer::Qrc>_>
              ._M_impl.super__Vector_impl_data._M_start;
    pQVar7 = *(pointer *)
              ((long)&(local_290->Rcc).Qrcs.
                      super__Vector_base<cmQtAutoGenInitializer::Qrc,_std::allocator<cmQtAutoGenInitializer::Qrc>_>
                      ._M_impl.super__Vector_impl_data + 8);
    if (pQVar33 != pQVar7) {
      lVar29 = 0;
      pQVar36 = pQVar33;
      do {
        pQVar36->Unique = true;
        pQVar30 = pQVar33;
        lVar32 = lVar29;
        do {
          if (((lVar32 != 0) &&
              (sVar2 = (pQVar36->QrcName)._M_string_length,
              sVar2 == (pQVar30->QrcName)._M_string_length)) &&
             ((sVar2 == 0 ||
              (iVar18 = bcmp((pQVar36->QrcName)._M_dataplus._M_p,(pQVar30->QrcName)._M_dataplus._M_p
                             ,sVar2), iVar18 == 0)))) {
            pQVar36->Unique = false;
            break;
          }
          pQVar30 = pQVar30 + 1;
          lVar32 = lVar32 + -0x148;
        } while (pQVar30 != pQVar7);
        pQVar36 = pQVar36 + 1;
        lVar29 = lVar29 + 0x148;
      } while (pQVar36 != pQVar7);
    }
    cmFilePathChecksum::cmFilePathChecksum((cmFilePathChecksum *)local_1b8,local_258);
    pcVar26 = (cmMakefile *)
              (local_290->Rcc).Qrcs.
              super__Vector_base<cmQtAutoGenInitializer::Qrc,_std::allocator<cmQtAutoGenInitializer::Qrc>_>
              ._M_impl.super__Vector_impl_data._M_start;
    local_250 = *(cmMakefile **)
                 ((long)&(local_290->Rcc).Qrcs.
                         super__Vector_base<cmQtAutoGenInitializer::Qrc,_std::allocator<cmQtAutoGenInitializer::Qrc>_>
                         ._M_impl.super__Vector_impl_data + 8);
    if (pcVar26 != local_250) {
      do {
        cmFilePathChecksum::getPart
                  ((string *)local_2b8,(cmFilePathChecksum *)local_1b8,
                   (string *)
                   &(pcVar26->FindPackageRootPathStack).
                    super__Deque_base<std::vector<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>,_std::allocator<std::vector<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>_>_>
                    ._M_impl.super__Deque_impl_data._M_start._M_last,10);
        std::__cxx11::string::operator=
                  ((string *)
                   ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
                     *)&pcVar26->CMP0054ReportedIds + 1),(string *)local_2b8);
        if ((cmMakefile *)local_2b8._0_8_ != (cmMakefile *)(local_2b8 + 0x10)) {
          operator_delete((void *)local_2b8._0_8_,(ulong)(local_2b8._16_8_ + 1));
        }
        local_2b8._0_8_ = local_2b8 + 0x10;
        pcVar8 = (local_290->Dir).Build._M_dataplus._M_p;
        std::__cxx11::string::_M_construct<char*>
                  ((string *)local_2b8,pcVar8,pcVar8 + (local_290->Dir).Build._M_string_length);
        std::__cxx11::string::append(local_2b8);
        std::__cxx11::string::_M_append
                  (local_2b8,
                   ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
                     *)&pcVar26->CMP0054ReportedIds)[1]._M_allocated_capacity);
        std::__cxx11::string::append(local_2b8);
        std::__cxx11::string::_M_append
                  (local_2b8,
                   (ulong)(pcVar26->FindPackageRootPathStack).
                          super__Deque_base<std::vector<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>,_std::allocator<std::vector<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>_>_>
                          ._M_impl.super__Deque_impl_data._M_finish._M_last);
        std::__cxx11::string::append(local_2b8);
        std::__cxx11::string::operator=
                  ((string *)
                   &(pcVar26->SourceFiles).
                    super__Vector_base<cmSourceFile_*,_std::allocator<cmSourceFile_*>_>._M_impl.
                    super__Vector_impl_data._M_finish,(string *)local_2b8);
        if ((undefined1 *)local_2b8._0_8_ != local_2b8 + 0x10) {
          operator_delete((void *)local_2b8._0_8_,(ulong)(local_2b8._16_8_ + 1));
        }
        local_2b8._0_8_ = local_2b8 + 0x10;
        pcVar8 = (local_290->Dir).Info._M_dataplus._M_p;
        std::__cxx11::string::_M_construct<char*>
                  ((string *)local_2b8,pcVar8,pcVar8 + (local_290->Dir).Info._M_string_length);
        std::__cxx11::string::append(local_2b8);
        std::__cxx11::string::_M_append
                  (local_2b8,
                   (ulong)(pcVar26->FindPackageRootPathStack).
                          super__Deque_base<std::vector<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>,_std::allocator<std::vector<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>_>_>
                          ._M_impl.super__Deque_impl_data._M_finish._M_last);
        if (*(char *)((long)&pcVar26->SourceFileSearchIndex + 0x11) == '\0') {
          std::__cxx11::string::_M_append
                    (local_2b8,
                     ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
                       *)&pcVar26->CMP0054ReportedIds)[1]._M_allocated_capacity);
        }
        std::__cxx11::string::_M_assign((string *)pcVar26);
        std::__cxx11::string::append((char *)pcVar26);
        std::__cxx11::string::_M_assign((string *)&pcVar26->Targets);
        std::__cxx11::string::append((char *)&pcVar26->Targets);
        filename = &(pcVar26->Targets)._M_h._M_rehash_policy;
        std::__cxx11::string::_M_assign((string *)filename);
        std::__cxx11::string::append((char *)filename);
        local_258 = pcVar26;
        if (local_290->MultiConfig == true) {
          pbVar27 = (local_290->ConfigsList).
                    super__Vector_base<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
                    ._M_impl.super__Vector_impl_data._M_start;
          pbVar4 = (local_290->ConfigsList).
                   super__Vector_base<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
                   ._M_impl.super__Vector_impl_data._M_finish;
          if (pbVar27 != pbVar4) {
            do {
              std::operator+(&local_218,"_",pbVar27);
              cmQtAutoGen::AppendFilenameSuffix((string *)local_288,(string *)filename,&local_218);
              this_01 = std::
                        map<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::less<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_std::allocator<std::pair<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>_>
                        ::operator[]((map<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::less<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_std::allocator<std::pair<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>_>
                                      *)&(pcVar26->AliasTargets)._M_t._M_impl.super__Rb_tree_header,
                                     pbVar27);
              std::__cxx11::string::operator=((string *)this_01,(string *)local_288);
              if ((cmQtAutoGenInitializer *)local_288._0_8_ !=
                  (cmQtAutoGenInitializer *)(local_288 + 0x10)) {
                operator_delete((void *)local_288._0_8_,local_288._16_8_ + 1);
              }
              if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
                   *)local_218._M_dataplus._M_p != &local_218.field_2) {
                operator_delete(local_218._M_dataplus._M_p,local_218.field_2._0_8_ + 1);
              }
              pbVar27 = pbVar27 + 1;
            } while (pbVar27 != pbVar4);
          }
        }
        if ((cmMakefile *)local_2b8._0_8_ != (cmMakefile *)(local_2b8 + 0x10)) {
          operator_delete((void *)local_2b8._0_8_,(ulong)(local_2b8._16_8_ + 1));
        }
        pcVar26 = (cmMakefile *)&(local_258->KnownFileSearchIndex)._M_h._M_before_begin;
      } while (pcVar26 != local_250);
    }
    lVar29 = -0x100;
    paVar35 = &local_c8;
    do {
      if (paVar35 !=
          (anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
           *)(&paVar35->_M_allocated_capacity)[-2]) {
        operator_delete((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
                         *)(&paVar35->_M_allocated_capacity)[-2],paVar35->_M_allocated_capacity + 1)
        ;
      }
      if (&paVar35->_M_allocated_capacity + -4 != (size_type *)(&paVar35->_M_allocated_capacity)[-6]
         ) {
        operator_delete((size_type *)(&paVar35->_M_allocated_capacity)[-6],
                        (&paVar35->_M_allocated_capacity)[-4] + 1);
      }
      paVar35 = (anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
                 *)(&paVar35->_M_allocated_capacity + -8);
      lVar29 = lVar29 + 0x40;
    } while (lVar29 != 0);
    pQVar33 = (local_290->Rcc).Qrcs.
              super__Vector_base<cmQtAutoGenInitializer::Qrc,_std::allocator<cmQtAutoGenInitializer::Qrc>_>
              ._M_impl.super__Vector_impl_data._M_start;
    pQVar7 = *(pointer *)
              ((long)&(local_290->Rcc).Qrcs.
                      super__Vector_base<cmQtAutoGenInitializer::Qrc,_std::allocator<cmQtAutoGenInitializer::Qrc>_>
                      ._M_impl.super__Vector_impl_data + 8);
    if (pQVar33 != pQVar7) {
      do {
        std::
        vector<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
        ::vector((vector<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
                  *)local_2b8,
                 (vector<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
                  *)&local_248);
        local_1b8._0_8_ = local_1b8 + 0x10;
        pcVar8 = (pQVar33->QrcName)._M_dataplus._M_p;
        std::__cxx11::string::_M_construct<char*>
                  ((string *)local_1b8,pcVar8,pcVar8 + (pQVar33->QrcName)._M_string_length);
        if ((pointer)local_1b8._8_8_ != (pointer)0x0) {
          pbVar27 = (pointer)0x0;
          do {
            if (*(char *)(local_1b8._0_8_ + (long)pbVar27) == '-') {
              *(char *)(local_1b8._0_8_ + (long)pbVar27) = '_';
            }
            pbVar27 = (pointer)((long)&(pbVar27->_M_dataplus)._M_p + 1);
          } while ((pointer)local_1b8._8_8_ != pbVar27);
        }
        if (pQVar33->Unique == false) {
          std::__cxx11::string::append((char *)local_1b8);
          std::__cxx11::string::_M_append
                    ((char *)local_1b8,(ulong)(pQVar33->PathChecksum)._M_dataplus._M_p);
        }
        local_288._0_8_ = (cmQtAutoGenInitializer *)0x0;
        local_288._8_8_ = (Keywords *)0x0;
        local_288._16_8_ = 0;
        std::vector<std::__cxx11::string,std::allocator<std::__cxx11::string>>::
        emplace_back<char_const(&)[6]>
                  ((vector<std::__cxx11::string,std::allocator<std::__cxx11::string>> *)local_288,
                   (char (*) [6])0x54eac6);
        std::vector<std::__cxx11::string,std::allocator<std::__cxx11::string>>::
        emplace_back<std::__cxx11::string>
                  ((vector<std::__cxx11::string,std::allocator<std::__cxx11::string>> *)local_288,
                   (basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *)local_1b8);
        cmQtAutoGen::RccMergeOptions
                  ((vector<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
                    *)local_2b8,
                   (vector<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
                    *)local_288,4 < (uint)local_260);
        std::
        vector<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
        ::~vector((vector<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
                   *)local_288);
        if ((MUFile *)local_1b8._0_8_ != (MUFile *)(local_1b8 + 0x10)) {
          operator_delete((void *)local_1b8._0_8_,(ulong)(local_1a8._0_8_ + 1));
        }
        cmQtAutoGen::RccMergeOptions
                  ((vector<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
                    *)local_2b8,&pQVar33->Options,4 < (uint)local_260);
        local_1a8._0_8_ =
             (pQVar33->Options).
             super__Vector_base<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
             ._M_impl.super__Vector_impl_data._M_end_of_storage;
        (pQVar33->Options).
        super__Vector_base<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
        ._M_impl.super__Vector_impl_data._M_end_of_storage = (pointer)local_2b8._16_8_;
        local_1b8._0_8_ =
             (pQVar33->Options).
             super__Vector_base<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
             ._M_impl.super__Vector_impl_data._M_start;
        local_1b8._8_8_ =
             (pQVar33->Options).
             super__Vector_base<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
             ._M_impl.super__Vector_impl_data._M_finish;
        (pQVar33->Options).
        super__Vector_base<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
        ._M_impl.super__Vector_impl_data._M_start = (pointer)local_2b8._0_8_;
        (pQVar33->Options).
        super__Vector_base<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
        ._M_impl.super__Vector_impl_data._M_finish = (pointer)local_2b8._8_8_;
        local_2b8._0_8_ = (cmMakefile *)0x0;
        local_2b8._8_8_ = (Keywords *)0x0;
        local_2b8._16_8_ = (pointer)0x0;
        std::
        vector<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
        ::~vector((vector<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
                   *)local_1b8);
        std::
        vector<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
        ::~vector((vector<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
                   *)local_2b8);
        pQVar33 = pQVar33 + 1;
      } while (pQVar33 != pQVar7);
      pQVar33 = (local_290->Rcc).Qrcs.
                super__Vector_base<cmQtAutoGenInitializer::Qrc,_std::allocator<cmQtAutoGenInitializer::Qrc>_>
                ._M_impl.super__Vector_impl_data._M_start;
      pQVar7 = *(pointer *)
                ((long)&(local_290->Rcc).Qrcs.
                        super__Vector_base<cmQtAutoGenInitializer::Qrc,_std::allocator<cmQtAutoGenInitializer::Qrc>_>
                        ._M_impl.super__Vector_impl_data + 8);
      if (pQVar33 != pQVar7) {
        pcVar26 = (cmMakefile *)(local_2b8 + 0x10);
        files = &pQVar33->Resources;
        do {
          pcVar11 = local_290;
          if (((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
                *)(files + -2))[1]._M_local_buf[0] == '\0') {
            local_2b8._8_8_ = (Keywords *)0x0;
            local_2b8._16_8_ = local_2b8._16_8_ & 0xffffffffffffff00;
            local_70._M_dataplus._M_p = (pointer)&local_70.field_2;
            pcVar8 = (local_290->Rcc).super_GenVarsT.Executable._M_dataplus._M_p;
            local_2b8._0_8_ = pcVar26;
            std::__cxx11::string::_M_construct<char*>
                      ((string *)&local_70,pcVar8,
                       pcVar8 + (local_290->Rcc).super_GenVarsT.Executable._M_string_length);
            std::
            vector<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
            ::vector(&local_48,
                     &((pcVar11->Rcc).super_GenVarsT.ExecutableFeatures.
                       super___shared_ptr<cmQtAutoGen::CompilerFeatures,_(__gnu_cxx::_Lock_policy)2>
                      ._M_ptr)->ListOptions);
            cmQtAutoGen::RccLister::RccLister((RccLister *)local_1b8,&local_70,&local_48);
            std::
            vector<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
            ::~vector(&local_48);
            if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
                 *)local_70._M_dataplus._M_p != &local_70.field_2) {
              operator_delete(local_70._M_dataplus._M_p,local_70.field_2._M_allocated_capacity + 1);
            }
            bVar14 = cmQtAutoGen::RccLister::list
                               ((RccLister *)local_1b8,
                                (string *)
                                ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
                                  *)(files + -0xc) + 1),files,(string *)local_2b8,false);
            if (!bVar14) {
              cmSystemTools::Error((string *)local_2b8);
              std::
              vector<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
              ::~vector((vector<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
                         *)(local_1a8 + 0x10));
              if ((cmQtAutoGenInitializer *)local_1b8._0_8_ !=
                  (cmQtAutoGenInitializer *)(local_1b8 + 0x10)) {
                operator_delete((void *)local_1b8._0_8_,(ulong)(local_1a8._0_8_ + 1));
              }
              if ((cmMakefile *)local_2b8._0_8_ != pcVar26) {
                operator_delete((void *)local_2b8._0_8_,(ulong)(local_2b8._16_8_ + 1));
              }
              std::
              vector<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
              ::~vector((vector<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
                         *)&local_248);
              return false;
            }
            std::
            vector<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
            ::~vector((vector<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
                       *)(local_1a8 + 0x10));
            if ((cmQtAutoGenInitializer *)local_1b8._0_8_ !=
                (cmQtAutoGenInitializer *)(local_1b8 + 0x10)) {
              operator_delete((void *)local_1b8._0_8_,(ulong)(local_1a8._0_8_ + 1));
            }
            if ((cmMakefile *)local_2b8._0_8_ != pcVar26) {
              operator_delete((void *)local_2b8._0_8_,(ulong)(local_2b8._16_8_ + 1));
            }
          }
          pQVar33 = (pointer)(files + 1);
          files = (vector<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
                   *)((long)(files + 0xd) + 0x10);
        } while (pQVar33 != pQVar7);
      }
    }
    std::
    vector<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
    ::~vector((vector<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
               *)&local_248);
  }
  return true;
}

Assistant:

bool cmQtAutoGenInitializer::InitScanFiles()
{
  cmMakefile* makefile = this->Target->Target->GetMakefile();
  auto const& kw = this->GlobalInitializer->kw();

  auto makeMUFile = [this, &kw](cmSourceFile* sf, std::string const& fullPath,
                                bool muIt) -> MUFileHandle {
    MUFileHandle muf = cm::make_unique<MUFile>();
    muf->RealPath = cmSystemTools::GetRealPath(fullPath);
    muf->SF = sf;
    muf->Generated = sf->GetIsGenerated();
    bool const skipAutogen = sf->GetPropertyAsBool(kw.SKIP_AUTOGEN);
    muf->SkipMoc = this->Moc.Enabled &&
      (skipAutogen || sf->GetPropertyAsBool(kw.SKIP_AUTOMOC));
    muf->SkipUic = this->Uic.Enabled &&
      (skipAutogen || sf->GetPropertyAsBool(kw.SKIP_AUTOUIC));
    if (muIt) {
      muf->MocIt = this->Moc.Enabled && !muf->SkipMoc;
      muf->UicIt = this->Uic.Enabled && !muf->SkipUic;
    }
    return muf;
  };

  auto addMUFile = [&](MUFileHandle&& muf, bool isHeader) {
    if ((muf->MocIt || muf->UicIt) && muf->Generated) {
      this->AutogenTarget.FilesGenerated.emplace_back(muf.get());
    }
    if (isHeader) {
      this->AutogenTarget.Headers.emplace(muf->SF, std::move(muf));
    } else {
      this->AutogenTarget.Sources.emplace(muf->SF, std::move(muf));
    }
  };

  // Scan through target files
  {
    // Scan through target files
    std::vector<cmSourceFile*> srcFiles;
    this->Target->GetConfigCommonSourceFiles(srcFiles);
    for (cmSourceFile* sf : srcFiles) {
      // sf->GetExtension() is only valid after sf->GetFullPath() ...
      // Since we're iterating over source files that might be not in the
      // target we need to check for path errors (not existing files).
      std::string pathError;
      std::string const& fullPath = sf->GetFullPath(&pathError);
      if (!pathError.empty() || fullPath.empty()) {
        continue;
      }
      std::string const& ext = sf->GetExtension();

      // Register files that will be scanned by moc or uic
      if (this->MocOrUicEnabled()) {
        switch (cmSystemTools::GetFileFormat(ext)) {
          case cmSystemTools::HEADER_FILE_FORMAT:
            addMUFile(makeMUFile(sf, fullPath, true), true);
            break;
          case cmSystemTools::CXX_FILE_FORMAT:
            addMUFile(makeMUFile(sf, fullPath, true), false);
            break;
          default:
            break;
        }
      }

      // Register rcc enabled files
      if (this->Rcc.Enabled) {
        if ((ext == kw.qrc) && !sf->GetPropertyAsBool(kw.SKIP_AUTOGEN) &&
            !sf->GetPropertyAsBool(kw.SKIP_AUTORCC)) {
          // Register qrc file
          Qrc qrc;
          qrc.QrcFile = cmSystemTools::GetRealPath(fullPath);
          qrc.QrcName =
            cmSystemTools::GetFilenameWithoutLastExtension(qrc.QrcFile);
          qrc.Generated = sf->GetIsGenerated();
          // RCC options
          {
            std::string const opts = sf->GetSafeProperty(kw.AUTORCC_OPTIONS);
            if (!opts.empty()) {
              cmSystemTools::ExpandListArgument(opts, qrc.Options);
            }
          }
          this->Rcc.Qrcs.push_back(std::move(qrc));
        }
      }
    }
  }
  // cmGeneratorTarget::GetConfigCommonSourceFiles computes the target's
  // sources meta data cache. Clear it so that OBJECT library targets that
  // are AUTOGEN initialized after this target get their added
  // mocs_compilation.cpp source acknowledged by this target.
  this->Target->ClearSourcesCache();

  // For source files find additional headers and private headers
  if (this->MocOrUicEnabled()) {
    std::vector<MUFileHandle> extraHeaders;
    extraHeaders.reserve(this->AutogenTarget.Sources.size() * 2);
    // Header search suffixes and extensions
    std::array<std::string, 2> const suffixes{ { "", "_p" } };
    auto const& exts = makefile->GetCMakeInstance()->GetHeaderExtensions();
    // Scan through sources
    for (auto const& pair : this->AutogenTarget.Sources) {
      MUFile const& muf = *pair.second;
      if (muf.MocIt || muf.UicIt) {
        // Search for the default header file and a private header
        std::string const& srcPath = muf.SF->GetFullPath();
        std::string basePath = cmQtAutoGen::SubDirPrefix(srcPath);
        basePath += cmSystemTools::GetFilenameWithoutLastExtension(srcPath);
        for (auto const& suffix : suffixes) {
          std::string const suffixedPath = basePath + suffix;
          for (auto const& ext : exts) {
            std::string fullPath = suffixedPath;
            fullPath += '.';
            fullPath += ext;

            auto constexpr locationKind = cmSourceFileLocationKind::Known;
            cmSourceFile* sf = makefile->GetSource(fullPath, locationKind);
            if (sf != nullptr) {
              // Check if we know about this header already
              if (this->AutogenTarget.Headers.find(sf) !=
                  this->AutogenTarget.Headers.end()) {
                continue;
              }
              // We only accept not-GENERATED files that do exist.
              if (!sf->GetIsGenerated() &&
                  !cmSystemTools::FileExists(fullPath)) {
                continue;
              }
            } else if (cmSystemTools::FileExists(fullPath)) {
              // Create a new source file for the existing file
              sf = makefile->CreateSource(fullPath, false, locationKind);
            }

            if (sf != nullptr) {
              auto eMuf = makeMUFile(sf, fullPath, true);
              // Ony process moc/uic when the parent is processed as well
              if (!muf.MocIt) {
                eMuf->MocIt = false;
              }
              if (!muf.UicIt) {
                eMuf->UicIt = false;
              }
              extraHeaders.emplace_back(std::move(eMuf));
            }
          }
        }
      }
    }
    // Move generated files to main headers list
    for (auto& eMuf : extraHeaders) {
      addMUFile(std::move(eMuf), true);
    }
  }

  // Scan through all source files in the makefile to extract moc and uic
  // parameters.  Historically we support non target source file parameters.
  // The reason is that their file names might be discovered from source files
  // at generation time.
  if (this->MocOrUicEnabled()) {
    for (cmSourceFile* sf : makefile->GetSourceFiles()) {
      // sf->GetExtension() is only valid after sf->GetFullPath() ...
      // Since we're iterating over source files that might be not in the
      // target we need to check for path errors (not existing files).
      std::string pathError;
      std::string const& fullPath = sf->GetFullPath(&pathError);
      if (!pathError.empty() || fullPath.empty()) {
        continue;
      }
      std::string const& ext = sf->GetExtension();

      auto const fileFormat = cmSystemTools::GetFileFormat(ext);
      if (fileFormat == cmSystemTools::HEADER_FILE_FORMAT) {
        if (this->AutogenTarget.Headers.find(sf) ==
            this->AutogenTarget.Headers.end()) {
          auto muf = makeMUFile(sf, fullPath, false);
          if (muf->SkipMoc || muf->SkipUic) {
            this->AutogenTarget.Headers.emplace(sf, std::move(muf));
          }
        }
      } else if (fileFormat == cmSystemTools::CXX_FILE_FORMAT) {
        if (this->AutogenTarget.Sources.find(sf) ==
            this->AutogenTarget.Sources.end()) {
          auto muf = makeMUFile(sf, fullPath, false);
          if (muf->SkipMoc || muf->SkipUic) {
            this->AutogenTarget.Sources.emplace(sf, std::move(muf));
          }
        }
      } else if (this->Uic.Enabled && (ext == kw.ui)) {
        // .ui file
        std::string realPath = cmSystemTools::GetRealPath(fullPath);
        bool const skipAutogen = sf->GetPropertyAsBool(kw.SKIP_AUTOGEN);
        bool const skipUic =
          (skipAutogen || sf->GetPropertyAsBool(kw.SKIP_AUTOUIC));
        if (!skipUic) {
          // Check if the .ui file has uic options
          std::string const uicOpts = sf->GetSafeProperty(kw.AUTOUIC_OPTIONS);
          if (!uicOpts.empty()) {
            this->Uic.FileFiles.push_back(std::move(realPath));
            std::vector<std::string> optsVec;
            cmSystemTools::ExpandListArgument(uicOpts, optsVec);
            this->Uic.FileOptions.push_back(std::move(optsVec));
          }
        } else {
          // Register skipped .ui file
          this->Uic.SkipUi.insert(std::move(realPath));
        }
      }
    }
  }

  // Process GENERATED sources and headers
  if (this->MocOrUicEnabled() && !this->AutogenTarget.FilesGenerated.empty()) {
    if (this->CMP0071Accept) {
      // Let the autogen target depend on the GENERATED files
      for (MUFile* muf : this->AutogenTarget.FilesGenerated) {
        this->AutogenTarget.DependFiles.insert(muf->RealPath);
      }
    } else if (this->CMP0071Warn) {
      std::string msg;
      msg += cmPolicies::GetPolicyWarning(cmPolicies::CMP0071);
      msg += '\n';
      std::string property;
      if (this->Moc.Enabled && this->Uic.Enabled) {
        property = kw.SKIP_AUTOGEN;
      } else if (this->Moc.Enabled) {
        property = kw.SKIP_AUTOMOC;
      } else if (this->Uic.Enabled) {
        property = kw.SKIP_AUTOUIC;
      }
      msg += "For compatibility, CMake is excluding the GENERATED source "
             "file(s):\n";
      for (MUFile* muf : this->AutogenTarget.FilesGenerated) {
        msg += "  ";
        msg += Quoted(muf->RealPath);
        msg += '\n';
      }
      msg += "from processing by ";
      msg += cmQtAutoGen::Tools(this->Moc.Enabled, this->Uic.Enabled, false);
      msg += ". If any of the files should be processed, set CMP0071 to NEW. "
             "If any of the files should not be processed, "
             "explicitly exclude them by setting the source file property ";
      msg += property;
      msg += ":\n  set_property(SOURCE file.h PROPERTY ";
      msg += property;
      msg += " ON)\n";
      makefile->IssueMessage(MessageType::AUTHOR_WARNING, msg);
    }
  }

  // Process qrc files
  if (!this->Rcc.Qrcs.empty()) {
    const bool modernQt = (this->QtVersion.Major >= 5);
    // Target rcc options
    std::vector<std::string> optionsTarget;
    cmSystemTools::ExpandListArgument(
      this->Target->GetSafeProperty(kw.AUTORCC_OPTIONS), optionsTarget);

    // Check if file name is unique
    for (Qrc& qrc : this->Rcc.Qrcs) {
      qrc.Unique = true;
      for (Qrc const& qrc2 : this->Rcc.Qrcs) {
        if ((&qrc != &qrc2) && (qrc.QrcName == qrc2.QrcName)) {
          qrc.Unique = false;
          break;
        }
      }
    }
    // Path checksum and file names
    {
      cmFilePathChecksum const fpathCheckSum(makefile);
      for (Qrc& qrc : this->Rcc.Qrcs) {
        qrc.PathChecksum = fpathCheckSum.getPart(qrc.QrcFile);
        // RCC output file name
        {
          std::string rccFile = this->Dir.Build + "/";
          rccFile += qrc.PathChecksum;
          rccFile += "/qrc_";
          rccFile += qrc.QrcName;
          rccFile += ".cpp";
          qrc.RccFile = std::move(rccFile);
        }
        {
          std::string base = this->Dir.Info;
          base += "/RCC";
          base += qrc.QrcName;
          if (!qrc.Unique) {
            base += qrc.PathChecksum;
          }

          qrc.LockFile = base;
          qrc.LockFile += ".lock";

          qrc.InfoFile = base;
          qrc.InfoFile += "Info.cmake";

          qrc.SettingsFile = base;
          qrc.SettingsFile += "Settings.txt";

          if (this->MultiConfig) {
            for (std::string const& cfg : this->ConfigsList) {
              qrc.ConfigSettingsFile[cfg] =
                AppendFilenameSuffix(qrc.SettingsFile, "_" + cfg);
            }
          }
        }
      }
    }
    // RCC options
    for (Qrc& qrc : this->Rcc.Qrcs) {
      // Target options
      std::vector<std::string> opts = optionsTarget;
      // Merge computed "-name XYZ" option
      {
        std::string name = qrc.QrcName;
        // Replace '-' with '_'. The former is not valid for symbol names.
        std::replace(name.begin(), name.end(), '-', '_');
        if (!qrc.Unique) {
          name += "_";
          name += qrc.PathChecksum;
        }
        std::vector<std::string> nameOpts;
        nameOpts.emplace_back("-name");
        nameOpts.emplace_back(std::move(name));
        RccMergeOptions(opts, nameOpts, modernQt);
      }
      // Merge file option
      RccMergeOptions(opts, qrc.Options, modernQt);
      qrc.Options = std::move(opts);
    }
    // RCC resources
    for (Qrc& qrc : this->Rcc.Qrcs) {
      if (!qrc.Generated) {
        std::string error;
        RccLister const lister(this->Rcc.Executable,
                               this->Rcc.ExecutableFeatures->ListOptions);
        if (!lister.list(qrc.QrcFile, qrc.Resources, error)) {
          cmSystemTools::Error(error);
          return false;
        }
      }
    }
  }

  return true;
}